

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

CURLcode http_output_basic(Curl_easy *data,_Bool proxy)

{
  Curl_easy *data_00;
  char *__s;
  size_t insize;
  char *pcVar1;
  char *local_68;
  char *out;
  char *pcStack_48;
  CURLcode result;
  char *pwd;
  char *user;
  char **userp;
  char *authorization;
  size_t size;
  Curl_easy *pCStack_18;
  _Bool proxy_local;
  Curl_easy *data_local;
  
  authorization = (char *)0x0;
  userp = (char **)0x0;
  if (proxy) {
    user = (char *)&(data->state).aptr;
    pwd = (data->state).aptr.proxyuser;
    pcStack_48 = (data->state).aptr.proxypasswd;
  }
  else {
    user = (char *)&(data->state).aptr.userpwd;
    pwd = (data->state).aptr.user;
    pcStack_48 = (data->state).aptr.passwd;
  }
  if (pcStack_48 == (char *)0x0) {
    local_68 = "";
  }
  else {
    local_68 = pcStack_48;
  }
  size._7_1_ = proxy;
  pCStack_18 = data;
  __s = curl_maprintf("%s:%s",pwd,local_68);
  data_00 = pCStack_18;
  if (__s == (char *)0x0) {
    data_local._4_4_ = CURLE_OUT_OF_MEMORY;
  }
  else {
    insize = strlen(__s);
    out._4_4_ = Curl_base64_encode(data_00,__s,insize,(char **)&userp,(size_t *)&authorization);
    if (out._4_4_ == CURLE_OK) {
      if (userp == (char **)0x0) {
        out._4_4_ = CURLE_REMOTE_ACCESS_DENIED;
      }
      else {
        (*Curl_cfree)(*(void **)user);
        pcVar1 = "";
        if ((size._7_1_ & 1) != 0) {
          pcVar1 = "Proxy-";
        }
        pcVar1 = curl_maprintf("%sAuthorization: Basic %s\r\n",pcVar1,userp);
        *(char **)user = pcVar1;
        (*Curl_cfree)(userp);
        if (*(long *)user == 0) {
          out._4_4_ = CURLE_OUT_OF_MEMORY;
        }
      }
    }
    (*Curl_cfree)(__s);
    data_local._4_4_ = out._4_4_;
  }
  return data_local._4_4_;
}

Assistant:

static CURLcode http_output_basic(struct Curl_easy *data, bool proxy)
{
  size_t size = 0;
  char *authorization = NULL;
  char **userp;
  const char *user;
  const char *pwd;
  CURLcode result;
  char *out;

  /* credentials are unique per transfer for HTTP, do not use the ones for the
     connection */
  if(proxy) {
#ifndef CURL_DISABLE_PROXY
    userp = &data->state.aptr.proxyuserpwd;
    user = data->state.aptr.proxyuser;
    pwd = data->state.aptr.proxypasswd;
#else
    return CURLE_NOT_BUILT_IN;
#endif
  }
  else {
    userp = &data->state.aptr.userpwd;
    user = data->state.aptr.user;
    pwd = data->state.aptr.passwd;
  }

  out = aprintf("%s:%s", user, pwd ? pwd : "");
  if(!out)
    return CURLE_OUT_OF_MEMORY;

  result = Curl_base64_encode(data, out, strlen(out), &authorization, &size);
  if(result)
    goto fail;

  if(!authorization) {
    result = CURLE_REMOTE_ACCESS_DENIED;
    goto fail;
  }

  free(*userp);
  *userp = aprintf("%sAuthorization: Basic %s\r\n",
                   proxy ? "Proxy-" : "",
                   authorization);
  free(authorization);
  if(!*userp) {
    result = CURLE_OUT_OF_MEMORY;
    goto fail;
  }

  fail:
  free(out);
  return result;
}